

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O1

void __thiscall HighsMipSolver::cleanupSolve(HighsMipSolver *this)

{
  HighsMipAnalysis *this_00;
  HighsMipSolverData *pHVar1;
  HighsOptions *pHVar2;
  bool bVar3;
  int iVar4;
  undefined1 *__nbytes;
  double *pdVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  char *pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  array<char,_32UL> gapValString;
  string solutionstatus;
  array<char,_128UL> gapString;
  array<char,_32UL> gapTolString;
  string local_118;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 local_e8 [16];
  char local_d8 [136];
  array<char,_32UL> local_50;
  
  HighsMipSolverData::printDisplayLine
            ((this->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,0xf);
  this_00 = &this->analysis_;
  bVar3 = HighsMipAnalysis::mipTimerRunning(this_00,2);
  if (bVar3) {
    HighsMipAnalysis::mipTimerStop(this_00,2);
  }
  pHVar1 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsMipSolverData::updatePrimalDualIntegral
            (pHVar1,pHVar1->lower_bound,pHVar1->lower_bound,pHVar1->upper_bound,pHVar1->upper_bound,
             false,true);
  HighsMipAnalysis::mipTimerStart(this_00,3);
  dVar10 = this->solution_objective_;
  bVar3 = true;
  if (((dVar10 < INFINITY) &&
      (dVar9 = (this->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance,
      this->bound_violation_ <= dVar9)) && (this->integrality_violation_ <= dVar9)) {
    bVar3 = dVar9 < this->row_violation_;
  }
  pHVar1 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar9 = pHVar1->lower_bound;
  this->dual_bound_ = dVar9;
  dVar11 = (pHVar1->objectiveFunction).objIntScale;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    dVar7 = ceil(dVar9 * dVar11 - pHVar1->feastol);
    dVar8 = dVar7 / dVar11;
    if (dVar7 / dVar11 <= dVar9) {
      dVar8 = dVar9;
    }
    this->dual_bound_ = dVar8;
  }
  dVar9 = this->model_->offset_;
  dVar11 = this->dual_bound_ + dVar9;
  this->dual_bound_ = dVar11;
  dVar9 = dVar9 + pHVar1->upper_bound;
  this->primal_bound_ = dVar9;
  this->node_count_ = pHVar1->num_nodes;
  pdVar5 = &this->primal_bound_;
  if (dVar11 <= dVar9) {
    pdVar5 = &this->dual_bound_;
  }
  this->total_lp_iterations_ = pHVar1->total_lp_iterations;
  dVar11 = *pdVar5;
  this->dual_bound_ = dVar11;
  this->primal_dual_integral_ = (pHVar1->primal_dual_integral).value;
  if (this->orig_model_->sense_ == kMaximize) {
    this->dual_bound_ = -dVar11;
    this->primal_bound_ = -dVar9;
  }
  if ((this->modelstatus_ & ~kInfeasible) == kMin) {
    this->modelstatus_ = (byte)(INFINITY <= dVar10 | bVar3) + kOptimal;
  }
  HighsMipAnalysis::mipTimerStop(this_00,3);
  HighsTimer::stop(&this->timer_,0);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-","");
  if (dVar10 < INFINITY) {
    dVar10 = (this->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
    pcVar6 = "feasible";
    if (dVar10 < this->row_violation_) {
      pcVar6 = "infeasible";
    }
    if (dVar10 < this->integrality_violation_ || dVar10 < this->bound_violation_) {
      pcVar6 = "infeasible";
    }
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_f8,0,local_f0,(ulong)pcVar6);
  }
  dVar10 = this->primal_bound_;
  dVar9 = dVar10 - this->dual_bound_;
  this->gap_ = ABS(dVar9);
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar11 = INFINITY;
    if (dVar10 < INFINITY) {
      dVar11 = ABS(dVar9 / dVar10);
    }
  }
  else {
    dVar11 = (double)(~-(ulong)(this->dual_bound_ == 0.0) & 0x7ff0000000000000);
  }
  this->gap_ = dVar11;
  local_d8[0x70] = '\0';
  local_d8[0x71] = '\0';
  local_d8[0x72] = '\0';
  local_d8[0x73] = '\0';
  local_d8[0x74] = '\0';
  local_d8[0x75] = '\0';
  local_d8[0x76] = '\0';
  local_d8[0x77] = '\0';
  local_d8[0x78] = '\0';
  local_d8[0x79] = '\0';
  local_d8[0x7a] = '\0';
  local_d8[0x7b] = '\0';
  local_d8[0x7c] = '\0';
  local_d8[0x7d] = '\0';
  local_d8[0x7e] = '\0';
  local_d8[0x7f] = '\0';
  local_d8[0x60] = '\0';
  local_d8[0x61] = '\0';
  local_d8[0x62] = '\0';
  local_d8[99] = '\0';
  local_d8[100] = '\0';
  local_d8[0x65] = '\0';
  local_d8[0x66] = '\0';
  local_d8[0x67] = '\0';
  local_d8[0x68] = '\0';
  local_d8[0x69] = '\0';
  local_d8[0x6a] = '\0';
  local_d8[0x6b] = '\0';
  local_d8[0x6c] = '\0';
  local_d8[0x6d] = '\0';
  local_d8[0x6e] = '\0';
  local_d8[0x6f] = '\0';
  local_d8[0x50] = '\0';
  local_d8[0x51] = '\0';
  local_d8[0x52] = '\0';
  local_d8[0x53] = '\0';
  local_d8[0x54] = '\0';
  local_d8[0x55] = '\0';
  local_d8[0x56] = '\0';
  local_d8[0x57] = '\0';
  local_d8[0x58] = '\0';
  local_d8[0x59] = '\0';
  local_d8[0x5a] = '\0';
  local_d8[0x5b] = '\0';
  local_d8[0x5c] = '\0';
  local_d8[0x5d] = '\0';
  local_d8[0x5e] = '\0';
  local_d8[0x5f] = '\0';
  local_d8[0x40] = '\0';
  local_d8[0x41] = '\0';
  local_d8[0x42] = '\0';
  local_d8[0x43] = '\0';
  local_d8[0x44] = '\0';
  local_d8[0x45] = '\0';
  local_d8[0x46] = '\0';
  local_d8[0x47] = '\0';
  local_d8[0x48] = '\0';
  local_d8[0x49] = '\0';
  local_d8[0x4a] = '\0';
  local_d8[0x4b] = '\0';
  local_d8[0x4c] = '\0';
  local_d8[0x4d] = '\0';
  local_d8[0x4e] = '\0';
  local_d8[0x4f] = '\0';
  local_d8[0x30] = '\0';
  local_d8[0x31] = '\0';
  local_d8[0x32] = '\0';
  local_d8[0x33] = '\0';
  local_d8[0x34] = '\0';
  local_d8[0x35] = '\0';
  local_d8[0x36] = '\0';
  local_d8[0x37] = '\0';
  local_d8[0x38] = '\0';
  local_d8[0x39] = '\0';
  local_d8[0x3a] = '\0';
  local_d8[0x3b] = '\0';
  local_d8[0x3c] = '\0';
  local_d8[0x3d] = '\0';
  local_d8[0x3e] = '\0';
  local_d8[0x3f] = '\0';
  local_d8[0x20] = '\0';
  local_d8[0x21] = '\0';
  local_d8[0x22] = '\0';
  local_d8[0x23] = '\0';
  local_d8[0x24] = '\0';
  local_d8[0x25] = '\0';
  local_d8[0x26] = '\0';
  local_d8[0x27] = '\0';
  local_d8[0x28] = '\0';
  local_d8[0x29] = '\0';
  local_d8[0x2a] = '\0';
  local_d8[0x2b] = '\0';
  local_d8[0x2c] = '\0';
  local_d8[0x2d] = '\0';
  local_d8[0x2e] = '\0';
  local_d8[0x2f] = '\0';
  local_d8[0x10] = '\0';
  local_d8[0x11] = '\0';
  local_d8[0x12] = '\0';
  local_d8[0x13] = '\0';
  local_d8[0x14] = '\0';
  local_d8[0x15] = '\0';
  local_d8[0x16] = '\0';
  local_d8[0x17] = '\0';
  local_d8[0x18] = '\0';
  local_d8[0x19] = '\0';
  local_d8[0x1a] = '\0';
  local_d8[0x1b] = '\0';
  local_d8[0x1c] = '\0';
  local_d8[0x1d] = '\0';
  local_d8[0x1e] = '\0';
  local_d8[0x1f] = '\0';
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\0';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  local_d8[8] = '\0';
  local_d8[9] = '\0';
  local_d8[10] = '\0';
  local_d8[0xb] = '\0';
  local_d8[0xc] = '\0';
  local_d8[0xd] = '\0';
  local_d8[0xe] = '\0';
  local_d8[0xf] = '\0';
  if (dVar11 < INFINITY) {
    dVar10 = dVar11 * 0.1;
    if (0.01 <= dVar10) {
      dVar10 = 0.01;
    }
    dVar9 = 1e-06;
    if (1e-06 <= dVar10) {
      dVar9 = dVar10;
    }
    highsDoubleToString((array<char,_32UL> *)&local_118,dVar11 * 100.0,dVar9);
    pHVar2 = this->options_mip_;
    dVar10 = (pHVar2->super_HighsOptionsStruct).mip_rel_gap;
    dVar9 = (pHVar2->super_HighsOptionsStruct).mip_abs_gap;
    pdVar5 = &(pHVar2->super_HighsOptionsStruct).mip_feasibility_tolerance;
    dVar11 = dVar10;
    if (*pdVar5 <= dVar9 && dVar9 != *pdVar5) {
      dVar8 = this->primal_bound_;
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        dVar11 = dVar9 / ABS(dVar8);
        if (dVar9 / ABS(dVar8) <= dVar10) {
          dVar11 = dVar10;
        }
      }
      else {
        dVar11 = INFINITY;
      }
    }
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      if (dVar11 < INFINITY) {
        dVar10 = dVar11 * 0.1;
        if (0.01 <= dVar10) {
          dVar10 = 0.01;
        }
        dVar9 = 1e-06;
        if (1e-06 <= dVar10) {
          dVar9 = dVar10;
        }
        highsDoubleToString(&local_50,dVar11 * 100.0,dVar9);
        snprintf(local_d8,0x80,"%s%% (tolerance: %s%%)",&local_118,&local_50);
        goto LAB_002b8308;
      }
      pcVar6 = "%s%% (tolerance: inf)";
    }
    else {
      pcVar6 = "%s%%";
    }
    snprintf(local_d8,0x80,pcVar6,&local_118);
  }
  else {
    builtin_strncpy(local_d8,"inf",4);
    local_d8[4] = '\0';
    local_d8[5] = '\0';
    local_d8[6] = '\0';
    local_d8[7] = '\0';
  }
LAB_002b8308:
  bVar3 = (this->options_mip_->super_HighsOptionsStruct).timeless_log;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "\nSolving report\n");
  if ((this->orig_model_->model_name_)._M_string_length != 0) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  Model             %s\n",(this->orig_model_->model_name_)._M_dataplus._M_p);
  }
  pHVar2 = this->options_mip_;
  utilModelStatusToString_abi_cxx11_(&local_118,this->modelstatus_);
  highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
               "  Status            %s\n  Primal bound      %.12g\n  Dual bound        %.12g\n  Gap               %s\n"
               ,this->primal_bound_,this->dual_bound_,local_118._M_dataplus._M_p,local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar3 == false) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  P-D integral      %.12g\n",
                 (((this->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                 primal_dual_integral).value);
  }
  __nbytes = local_f8;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Solution status   %s\n");
  iVar4 = std::__cxx11::string::compare((char *)&local_f8);
  __buf = extraout_RDX;
  if (iVar4 != 0) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "                    %.12g (objective)\n                    %.12g (bound viol.)\n                    %.12g (int. viol.)\n                    %.12g (row viol.)\n"
                 ,this->solution_objective_,this->bound_violation_,this->integrality_violation_,
                 this->row_violation_);
    __buf = extraout_RDX_00;
  }
  if (bVar3 == false) {
    pHVar2 = this->options_mip_;
    HighsTimer::read(&this->timer_,0,__buf,(size_t)__nbytes);
    dVar10 = HighsMipAnalysis::mipTimerRead(this_00,1);
    dVar9 = HighsMipAnalysis::mipTimerRead(this_00,2);
    dVar11 = HighsMipAnalysis::mipTimerRead(this_00,3);
    highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                 "  Timing            %.2f (total)\n                    %.2f (presolve)\n                    %.2f (solve)\n                    %.2f (postsolve)\n"
                 ,extraout_XMM0_Qa,dVar10,dVar9,dVar11);
  }
  pHVar1 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Max sub-MIP depth %d\n  Nodes             %llu\n  Repair LPs        %llu (%llu feasible; %llu iterations)\n  LP iterations     %llu (total)\n                    %llu (strong br.)\n                    %llu (separation)\n                    %llu (heuristics)\n"
               ,(ulong)(uint)this->max_submip_level,pHVar1->num_nodes,pHVar1->total_repair_lp,
               pHVar1->total_repair_lp_feasible,pHVar1->total_repair_lp_iterations,
               pHVar1->total_lp_iterations,pHVar1->sb_lp_iterations,pHVar1->sepa_lp_iterations,
               pHVar1->heuristic_lp_iterations);
  if (bVar3 == false) {
    HighsMipAnalysis::reportMipTimer(this_00);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void HighsMipSolver::cleanupSolve() {
  // Force a final logging line
  mipdata_->printDisplayLine(kSolutionSourceCleanup);
  // Stop the solve clock - which won't be running if presolve
  // determines the model status
  if (analysis_.mipTimerRunning(kMipClockSolve))
    analysis_.mipTimerStop(kMipClockSolve);

  // Need to complete the calculation of P-D integral, checking for NO
  // gap change
  mipdata_->updatePrimalDualIntegral(
      mipdata_->lower_bound, mipdata_->lower_bound, mipdata_->upper_bound,
      mipdata_->upper_bound, false);
  analysis_.mipTimerStart(kMipClockPostsolve);

  bool havesolution = solution_objective_ != kHighsInf;
  bool feasible;
  if (havesolution)
    feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
  else
    feasible = false;

  dual_bound_ = mipdata_->lower_bound;
  if (mipdata_->objectiveFunction.isIntegral()) {
    double rounded_lower_bound =
        std::ceil(mipdata_->lower_bound *
                      mipdata_->objectiveFunction.integralScale() -
                  mipdata_->feastol) /
        mipdata_->objectiveFunction.integralScale();
    dual_bound_ = std::max(dual_bound_, rounded_lower_bound);
  }
  dual_bound_ += model_->offset_;
  primal_bound_ = mipdata_->upper_bound + model_->offset_;
  node_count_ = mipdata_->num_nodes;
  total_lp_iterations_ = mipdata_->total_lp_iterations;
  dual_bound_ = std::min(dual_bound_, primal_bound_);
  primal_dual_integral_ = mipdata_->primal_dual_integral.value;

  // adjust objective sense in case of maximization problem
  if (orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound_ = -dual_bound_;
    primal_bound_ = -primal_bound_;
  }

  if (modelstatus_ == HighsModelStatus::kNotset ||
      modelstatus_ == HighsModelStatus::kInfeasible) {
    if (feasible && havesolution)
      modelstatus_ = HighsModelStatus::kOptimal;
    else
      modelstatus_ = HighsModelStatus::kInfeasible;
  }

  analysis_.mipTimerStop(kMipClockPostsolve);
  timer_.stop();

  std::string solutionstatus = "-";

  if (havesolution) {
    bool feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
    solutionstatus = feasible ? "feasible" : "infeasible";
  }

  gap_ = fabs(primal_bound_ - dual_bound_);
  if (primal_bound_ == 0.0)
    gap_ = dual_bound_ == 0.0 ? 0.0 : kHighsInf;
  else if (primal_bound_ != kHighsInf)
    gap_ = fabs(primal_bound_ - dual_bound_) / fabs(primal_bound_);
  else
    gap_ = kHighsInf;

  std::array<char, 128> gapString = {};

  if (gap_ == kHighsInf)
    std::strcpy(gapString.data(), "inf");
  else {
    double printTol = std::max(std::min(1e-2, 1e-1 * gap_), 1e-6);
    auto gapValString = highsDoubleToString(100.0 * gap_, printTol);
    double gapTol = options_mip_->mip_rel_gap;

    if (options_mip_->mip_abs_gap > options_mip_->mip_feasibility_tolerance) {
      gapTol = primal_bound_ == 0.0
                   ? kHighsInf
                   : std::max(gapTol,
                              options_mip_->mip_abs_gap / fabs(primal_bound_));
    }

    if (gapTol == 0.0)
      std::snprintf(gapString.data(), gapString.size(), "%s%%",
                    gapValString.data());
    else if (gapTol != kHighsInf) {
      printTol = std::max(std::min(1e-2, 1e-1 * gapTol), 1e-6);
      auto gapTolString = highsDoubleToString(100.0 * gapTol, printTol);
      std::snprintf(gapString.data(), gapString.size(),
                    "%s%% (tolerance: %s%%)", gapValString.data(),
                    gapTolString.data());
    } else
      std::snprintf(gapString.data(), gapString.size(), "%s%% (tolerance: inf)",
                    gapValString.data());
  }

  bool timeless_log = options_mip_->timeless_log;
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "\nSolving report\n");
  if (this->orig_model_->model_name_.length())
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Model             %s\n",
                 this->orig_model_->model_name_.c_str());
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Status            %s\n"
               "  Primal bound      %.12g\n"
               "  Dual bound        %.12g\n"
               "  Gap               %s\n",
               utilModelStatusToString(modelstatus_).c_str(), primal_bound_,
               dual_bound_, gapString.data());
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  P-D integral      %.12g\n",
                 mipdata_->primal_dual_integral.value);
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Solution status   %s\n", solutionstatus.c_str());
  if (solutionstatus != "-")
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "                    %.12g (objective)\n"
                 "                    %.12g (bound viol.)\n"
                 "                    %.12g (int. viol.)\n"
                 "                    %.12g (row viol.)\n",
                 solution_objective_, bound_violation_, integrality_violation_,
                 row_violation_);
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Timing            %.2f (total)\n"
                 "                    %.2f (presolve)\n"
                 "                    %.2f (solve)\n"
                 "                    %.2f (postsolve)\n",
                 timer_.read(), analysis_.mipTimerRead(kMipClockPresolve),
                 analysis_.mipTimerRead(kMipClockSolve),
                 analysis_.mipTimerRead(kMipClockPostsolve));
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Max sub-MIP depth %d\n"
               "  Nodes             %llu\n"
               "  Repair LPs        %llu (%llu feasible; %llu iterations)\n"
               "  LP iterations     %llu (total)\n"
               "                    %llu (strong br.)\n"
               "                    %llu (separation)\n"
               "                    %llu (heuristics)\n",
               int(max_submip_level), (long long unsigned)mipdata_->num_nodes,
               (long long unsigned)mipdata_->total_repair_lp,
               (long long unsigned)mipdata_->total_repair_lp_feasible,
               (long long unsigned)mipdata_->total_repair_lp_iterations,
               (long long unsigned)mipdata_->total_lp_iterations,
               (long long unsigned)mipdata_->sb_lp_iterations,
               (long long unsigned)mipdata_->sepa_lp_iterations,
               (long long unsigned)mipdata_->heuristic_lp_iterations);

  if (!timeless_log) analysis_.reportMipTimer();

  assert(modelstatus_ != HighsModelStatus::kNotset);
}